

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

string * __thiscall
StringInstance::value_abi_cxx11_(string *__return_storage_ptr__,StringInstance *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->_value);
  return __return_storage_ptr__;
}

Assistant:

std::string StringInstance::value() const {
    return _value;
}